

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O3

int pt_evt_reset(pt_event_decoder *decoder)

{
  int extraout_EAX;
  
  (decoder->packet).type = ppt_invalid;
  decoder->status = -3;
  decoder->event = (pt_event *)0x0;
  decoder->field_0x72c = decoder->field_0x72c & 0xce;
  pt_last_ip_init(&decoder->ip);
  pt_time_init(&decoder->time);
  pt_tcal_init(&decoder->tcal);
  pt_evq_init(&decoder->evq);
  return extraout_EAX;
}

Assistant:

static int pt_evt_reset(struct pt_event_decoder *decoder)
{
	if (!decoder)
		return -pte_internal;

	decoder->packet.type = ppt_invalid;
	decoder->status = -pte_nosync;
	decoder->event = NULL;
	decoder->enabled = 0;
	decoder->bound = 0;
	decoder->mode_exec_valid = 0;

	pt_last_ip_init(&decoder->ip);
	pt_time_init(&decoder->time);
	pt_tcal_init(&decoder->tcal);
	pt_evq_init(&decoder->evq);

	return 0;
}